

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O3

void onsig(int param_1)

{
  ulong uVar1;
  undefined4 in_register_0000003c;
  ulong uVar2;
  
  if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
    endwin(CONCAT44(in_register_0000003c,param_1));
    initscr();
    noecho();
    cbreak();
    keypad(_stdscr,1);
    refresh();
    if (_stdscr == 0) {
      uVar2 = 0xffffffff;
      uVar1 = 0xffffffff;
    }
    else {
      uVar2 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      uVar1 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
    }
    (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[3])(cmCursesForm::CurrentForm,1,1,uVar1,uVar2);
    (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[4])();
  }
  signal(0x1c,onsig);
  return;
}

Assistant:

void onsig(int)
{
  if (cmCursesForm::CurrentForm)
    {
    endwin();
    initscr(); /* Initialization */
    noecho(); /* Echo off */
    cbreak(); /* nl- or cr not needed */
    keypad(stdscr,TRUE); /* Use key symbols as
                            KEY_DOWN*/
    refresh();
    int x,y;
    getmaxyx(stdscr, y, x);
    cmCursesForm::CurrentForm->Render(1,1,x,y);
    cmCursesForm::CurrentForm->UpdateStatusBar();
    }
  signal(SIGWINCH, onsig);
}